

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

int __thiscall QProcess::close(QProcess *this,int __fd)

{
  uint uVar1;
  int iVar2;
  int __sig;
  __pid_t __pid;
  int __fd_00;
  QIODevicePrivate *unaff_retaddr;
  QProcessPrivate *d;
  QProcess *pQVar3;
  
  pQVar3 = this;
  d_func((QProcess *)0x79136b);
  QIODevice::aboutToClose((QIODevice *)0x791379);
  do {
    __pid = -1;
    uVar1 = (*(this->super_QIODevice).super_QObject._vptr_QObject[0x18])();
    iVar2 = (int)((ulong)pQVar3 >> 0x20);
  } while ((uVar1 & 1) != 0);
  kill(this,__pid,__sig);
  waitForFinished((QProcess *)unaff_retaddr,iVar2);
  __fd_00 = 0;
  QIODevicePrivate::setWriteChannelCount(unaff_retaddr,iVar2);
  iVar2 = QIODevice::close(&this->super_QIODevice,__fd_00);
  return iVar2;
}

Assistant:

void QProcess::close()
{
    Q_D(QProcess);
    emit aboutToClose();
    while (waitForBytesWritten(-1))
        ;
    kill();
    waitForFinished(-1);
    d->setWriteChannelCount(0);
    QIODevice::close();
}